

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscParserRoutines.cpp
# Opt level: O0

CNscPStackEntry * NscBuildCase(int nToken,CNscPStackEntry *pCond)

{
  bool bVar1;
  NscType NVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  CNscPStackEntry *in_RSI;
  int in_EDI;
  NscPCode nPCode;
  int nCaseValue;
  NscSymbolFence *pFence;
  size_t nCondSize;
  uchar *pauchCond;
  CNscPStackEntry *pOut;
  undefined4 in_stack_ffffffffffffff68;
  NscType in_stack_ffffffffffffff6c;
  CNscContext *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffff80;
  uchar *puVar6;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffff88;
  size_t nCaseSize;
  undefined4 in_stack_ffffffffffffff90;
  NscPCode nCode;
  iterator in_stack_ffffffffffffffa0;
  NscSymbolFence *local_38;
  size_t local_30;
  uchar *local_28;
  CNscContext *local_20;
  CNscPStackEntry *local_18;
  int local_c;
  
  local_18 = in_RSI;
  local_c = in_EDI;
  local_20 = (CNscContext *)
             CNscContext::GetPStackEntry
                       (in_stack_ffffffffffffff70,
                        (char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),0);
  bVar1 = CNscContext::IsPhase2(g_pCtx);
  if ((!bVar1) && (bVar1 = CNscContext::IsNWScript(g_pCtx), !bVar1)) {
    if (local_18 != (CNscPStackEntry *)0x0) {
      CNscContext::FreePStackEntry
                (in_stack_ffffffffffffff70,
                 (CNscPStackEntry *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    }
    CNscPStackEntry::SetType((CNscPStackEntry *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c)
    ;
    return (CNscPStackEntry *)local_20;
  }
  if ((local_18 == (CNscPStackEntry *)0x0) ||
     (NVar2 = CNscPStackEntry::GetType(local_18), NVar2 != NscType_Error)) {
    local_28 = (uchar *)0x0;
    local_30 = 0;
    if (local_18 != (CNscPStackEntry *)0x0) {
      local_28 = CNscPStackEntry::GetData(local_18);
      local_30 = CNscPStackEntry::GetDataSize(local_18);
    }
    if (local_c == 0x128) {
      if ((local_18 == (CNscPStackEntry *)0x0) ||
         (NVar2 = CNscPStackEntry::GetType(local_18), NVar2 != NscType_Integer)) {
        CNscContext::GenerateMessage(g_pCtx,NscMessage_ErrorConditionalTokenRequiresInt,"case");
        CNscPStackEntry::SetType
                  ((CNscPStackEntry *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
      }
      NVar2 = CNscPStackEntry::GetType((CNscPStackEntry *)local_20);
      if (NVar2 != NscType_Error) {
        NscSimplifyConstant(local_28,&local_30);
        bVar1 = CNscPStackEntry::IsSimpleConstant(local_28,local_30);
        if (!bVar1) {
          CNscContext::GenerateMessage(g_pCtx,NscMessage_ErrorCaseValueNotConstant);
          CNscPStackEntry::SetType
                    ((CNscPStackEntry *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
        }
      }
    }
    NVar2 = CNscPStackEntry::GetType((CNscPStackEntry *)local_20);
    if (NVar2 != NscType_Error) {
      local_38 = CNscContext::GetCurrentFence(g_pCtx);
      while( true ) {
        bVar1 = false;
        if (local_38 != (NscSymbolFence *)0x0) {
          bVar1 = local_38->nFenceType == NscFenceType_Scope;
        }
        if (!bVar1) break;
        local_38 = local_38->pNext;
      }
      if ((local_38 == (NscSymbolFence *)0x0) || (local_38->nFenceType != NscFenceType_Switch)) {
        CNscContext::GenerateMessage(g_pCtx,NscMessage_WarningCaseDefaultOutsideSwitch);
        goto LAB_00206e5f;
      }
      if (local_38->nLocals != 0) {
        pcVar5 = "case";
        if (local_c == 0x12a) {
          pcVar5 = "default";
        }
        CNscContext::GenerateMessage(g_pCtx,NscMessage_ErrorDeclarationSkippedByToken,pcVar5);
      }
      if (local_c == 0x12a) {
        if ((local_38->fHasDefault & 1U) == 0) {
          local_38->fHasDefault = true;
        }
        else {
          CNscContext::GenerateMessage(g_pCtx,NscMessage_ErrorMultipleDefaultLabels);
          CNscPStackEntry::SetType
                    ((CNscPStackEntry *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
        }
      }
      else {
        uVar3 = CNscPStackEntry::GetInteger((CNscPStackEntry *)in_stack_ffffffffffffff70);
        std::vector<int,_std::allocator<int>_>::begin
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
        std::vector<int,_std::allocator<int>_>::end
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
        std::find<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
                  (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                   (int *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
        in_stack_ffffffffffffffa0 =
             std::vector<int,_std::allocator<int>_>::end
                       ((vector<int,_std::allocator<int>_> *)
                        CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                           in_stack_ffffffffffffff70,
                           (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                           CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
        if (bVar1) {
          CNscContext::GenerateMessage(g_pCtx,NscMessage_ErrorDuplicateCaseValue,(ulong)uVar3);
        }
        else {
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff80._M_current,
                     (value_type_conflict2 *)
                     CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
        }
      }
    }
    NVar2 = CNscPStackEntry::GetType((CNscPStackEntry *)local_20);
    if (NVar2 != NscType_Error) {
      if (local_c == 0x128) {
        nCode = NscPCode_Case;
      }
      else {
        if (local_c != 0x12a) {
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscParserRoutines.cpp"
                        ,0x1652,"CNscPStackEntry *NscBuildCase(int, CNscPStackEntry *)");
        }
        nCode = NscPCode_Default;
      }
      in_stack_ffffffffffffff70 = local_20;
      puVar6 = local_28;
      nCaseSize = local_30;
      iVar4 = CNscContext::GetFile(g_pCtx,0);
      CNscContext::GetLine(g_pCtx,0);
      CNscPStackEntry::PushCase
                ((CNscPStackEntry *)in_stack_ffffffffffffffa0._M_current,nCode,
                 (uchar *)CONCAT44(iVar4,in_stack_ffffffffffffff90),nCaseSize,
                 (int)((ulong)puVar6 >> 0x20),(int)puVar6);
      CNscPStackEntry::SetType
                ((CNscPStackEntry *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
    }
  }
  else {
    CNscPStackEntry::SetType((CNscPStackEntry *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c)
    ;
  }
LAB_00206e5f:
  if (local_18 != (CNscPStackEntry *)0x0) {
    CNscContext::FreePStackEntry
              (in_stack_ffffffffffffff70,
               (CNscPStackEntry *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  }
  return (CNscPStackEntry *)local_20;
}

Assistant:

YYSTYPE NscBuildCase (int nToken, YYSTYPE pCond)
{
	CNscPStackEntry *pOut = g_pCtx ->GetPStackEntry (__FILE__, __LINE__);

	//
	// If this is phase1 and we are in a function, do nothing
	//

	if (!g_pCtx ->IsPhase2 () && !g_pCtx ->IsNWScript ())
	{
		if (pCond)
			g_pCtx ->FreePStackEntry (pCond);
		pOut ->SetType (NscType_Unknown);
		return pOut;
	}

	//
	// Check for silent errors
	//

	if (pCond != NULL && pCond ->GetType () == NscType_Error)
	{
		pOut ->SetType (NscType_Error);
	}

	//
	// Otherwise, normal processing
	//

	else
	{

		//
		// Get the conditional
		//

		unsigned char *pauchCond = NULL;
		size_t nCondSize = 0;
		if (pCond)
		{
			pauchCond = pCond ->GetData ();
			nCondSize = pCond ->GetDataSize ();
		}

		//
		// If this is a case
		//

		if (nToken == CASE)
		{

			//
			// Validate the conditional
			//

			if (pCond == NULL || pCond ->GetType () != NscType_Integer)
			{
				g_pCtx ->GenerateMessage (
					NscMessage_ErrorConditionalTokenRequiresInt,
					"case");
				pOut ->SetType (NscType_Error);
			}

			//
			// Make sure the conditional is constant.
			//
			// We have to make a special check for a negated integer
			// to support unoptimized Bioware script support.
			//

			if (pOut ->GetType () != NscType_Error)
			{
				
				//
				// Simplify the constant
				//

				NscSimplifyConstant (pauchCond, nCondSize);

				//
				// Not a simple constant integer
				//

				if (!CNscPStackEntry::IsSimpleConstant (pauchCond, nCondSize))
				{
					g_pCtx ->GenerateMessage (NscMessage_ErrorCaseValueNotConstant);
					pOut ->SetType (NscType_Error);
				}
			}
		}

		//
		// If we are still good
		//

		if (pOut ->GetType () != NscType_Error)
		{

			//
			// Validate that the case or default is in a proper scope
			//

			NscSymbolFence *pFence = g_pCtx ->GetCurrentFence ();
			while (pFence && pFence ->nFenceType == NscFenceType_Scope)
				pFence = pFence ->pNext;
			if (pFence == NULL || pFence ->nFenceType != NscFenceType_Switch)
			{
				g_pCtx ->GenerateMessage (
					NscMessage_WarningCaseDefaultOutsideSwitch);
				goto no_switch_fence;
				//pOut ->SetType (NscType_Error);
			}
			else
			{
				if (pFence ->nLocals != 0)
				{
					g_pCtx ->GenerateMessage (
						NscMessage_ErrorDeclarationSkippedByToken,
						(nToken == DEFAULT) ? "default" : "case");

				}
			}

			//
			// Test for only one default
			//

			if (nToken == DEFAULT)
			{
				if (pFence ->fHasDefault)
				{
					g_pCtx ->GenerateMessage (
						NscMessage_ErrorMultipleDefaultLabels);
					pOut ->SetType (NscType_Error);
				}
				else
					pFence ->fHasDefault = true;
			}
			else
			{

				//
				// Test for non-unique case scan value
				//

				int nCaseValue = pCond ->GetInteger ();

				if (std::find (
					pFence ->pSwitchCasesUsed ->begin (),
					pFence ->pSwitchCasesUsed ->end (),
					nCaseValue) != pFence ->pSwitchCasesUsed ->end ()) {

					g_pCtx ->GenerateMessage (
						NscMessage_ErrorDuplicateCaseValue,
						nCaseValue);
				}
				else
					pFence ->pSwitchCasesUsed ->push_back (nCaseValue);
			}
		}

		//
		// If we are still good
		//

		if (pOut ->GetType () != NscType_Error)
		{

			//
			// Push the pcode
			//

			NscPCode nPCode;
			if (nToken == CASE)
				nPCode = NscPCode_Case;
			else if (nToken == DEFAULT)
				nPCode = NscPCode_Default;
			else
			{
				nPCode = NscPCode_Case;
				assert (false);
			}
			pOut ->PushCase (nPCode, pauchCond, nCondSize,
				g_pCtx ->GetFile (0), g_pCtx ->GetLine (0));

			//
			// Set the return type
			//

			pOut ->SetType (NscType_Unknown);
		}
	}

	//
	// Return results
	//

no_switch_fence:
	if (pCond)
        g_pCtx ->FreePStackEntry (pCond);
	return pOut;
}